

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Ay_Emu::run_clocks(Ay_Emu *this,blip_time_t *duration,int param_2)

{
  blip_time_t *pbVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  cpu_time_t end_time;
  long lVar4;
  state_t *psVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  
  psVar5 = (this->super_Ay_Cpu).state;
  psVar5->time = -psVar5->base;
  if (this->cpc_mode == false && this->spectrum_mode == false) {
    *duration = *duration / 2;
  }
  psVar5 = (this->super_Ay_Cpu).state;
  iVar6 = psVar5->base + psVar5->time;
  iVar7 = *duration;
  if (iVar6 < iVar7) {
    do {
      end_time = this->next_play;
      if (iVar7 < this->next_play) {
        end_time = iVar7;
      }
      Ay_Cpu::run(&this->super_Ay_Cpu,end_time);
      psVar5 = (this->super_Ay_Cpu).state;
      if ((this->next_play <= psVar5->base + psVar5->time) &&
         (this->next_play = this->next_play + this->play_period, (this->super_Ay_Cpu).r.iff1 != '\0'
         )) {
        uVar8 = (this->super_Ay_Cpu).r.pc;
        if ((this->mem).ram[uVar8] == 'v') {
          (this->super_Ay_Cpu).r.pc = uVar8 + 1;
        }
        (this->super_Ay_Cpu).r.iff1 = '\0';
        (this->super_Ay_Cpu).r.iff2 = '\0';
        uVar2 = (this->super_Ay_Cpu).r.pc;
        uVar3 = (this->super_Ay_Cpu).r.sp;
        uVar8 = uVar3 - 1;
        (this->super_Ay_Cpu).r.sp = uVar8;
        (this->mem).ram[uVar8] = (byte)(uVar2 >> 8);
        uVar8 = uVar3 - 2;
        (this->super_Ay_Cpu).r.sp = uVar8;
        (this->mem).ram[uVar8] = (byte)uVar2;
        (this->super_Ay_Cpu).r.pc = 0x38;
        iVar7 = psVar5->time;
        psVar5->time = iVar7 + 0xc;
        if ((this->super_Ay_Cpu).r.im == '\x02') {
          psVar5->time = iVar7 + 0x12;
          lVar4 = (ulong)(this->super_Ay_Cpu).r.i * 0x100;
          (this->super_Ay_Cpu).r.pc =
               CONCAT11((this->mem).ram[(int)lVar4 + 0x100U & 0xffff],(this->mem).ram[lVar4 + 0xff])
          ;
        }
      }
      psVar5 = (this->super_Ay_Cpu).state;
      iVar6 = psVar5->base + psVar5->time;
      iVar7 = *duration;
    } while (iVar6 < iVar7);
  }
  *duration = iVar6;
  this->next_play = this->next_play - iVar6;
  psVar5->time = psVar5->time - *duration;
  iVar7 = *duration;
  if ((this->apu).last_time < iVar7) {
    Ay_Apu::run_until(&this->apu,iVar7);
  }
  pbVar1 = &(this->apu).last_time;
  *pbVar1 = *pbVar1 - iVar7;
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Ay_Emu::run_clocks( blip_time_t& duration, int )
{
	set_time( 0 );
	if ( !(spectrum_mode | cpc_mode) )
		duration /= 2; // until mode is set, leave room for halved clock rate
	
	while ( time() < duration )
	{
		cpu::run( min( duration, (blip_time_t) next_play ) );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			
			if ( r.iff1 )
			{
				if ( mem.ram [r.pc] == 0x76 )
					r.pc++;
				
				r.iff1 = r.iff2 = 0;
				
				mem.ram [--r.sp] = uint8_t (r.pc >> 8);
				mem.ram [--r.sp] = uint8_t (r.pc);
				r.pc = 0x38;
				cpu::adjust_time( 12 );
				if ( r.im == 2 )
				{
					cpu::adjust_time( 6 );
					unsigned addr = r.i * 0x100u + 0xFF;
					r.pc = mem.ram [(addr + 1) & 0xFFFF] * 0x100u + mem.ram [addr];
				}
			}
		}
	}
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	
	apu.end_frame( duration );
	
	return 0;
}